

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_specialspot.cpp
# Opt level: O0

int AF_DSpotState_GetNextInList
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  DSpotState *this;
  PClassActor *type_00;
  ASpecialSpot *val;
  bool bVar1;
  bool local_5e;
  bool local_5b;
  ASpecialSpot *state;
  int skipcounter;
  MetaClass *type;
  DSpotState *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_specialspot.cpp"
                  ,0x149,
                  "int AF_DSpotState_GetNextInList(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar1) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_specialspot.cpp"
                  ,0x149,
                  "int AF_DSpotState_GetNextInList(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (DSpotState *)(param->field_0).field_1.a;
  local_5b = true;
  if (this != (DSpotState *)0x0) {
    local_5b = DObject::IsKindOf((DObject *)this,DSpotState::RegistrationInfo.MyClass);
  }
  if (local_5b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(DSpotState))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_specialspot.cpp"
                  ,0x149,
                  "int AF_DSpotState_GetNextInList(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_specialspot.cpp"
                  ,0x14a,
                  "int AF_DSpotState_GetNextInList(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar1 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar1 = true, param[1].field_0.field_1.atag != 1)) {
    bVar1 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (bVar1) {
    type_00 = (PClassActor *)param[1].field_0.field_1.a;
    local_5e = true;
    if (type_00 != (PClassActor *)0x0) {
      local_5e = PClass::IsDescendantOf((PClass *)type_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_5e == false) {
      __assert_fail("type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_specialspot.cpp"
                    ,0x14a,
                    "int AF_DSpotState_GetNextInList(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (numparam < 3) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_specialspot.cpp"
                    ,0x14b,
                    "int AF_DSpotState_GetNextInList(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (param[2].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_specialspot.cpp"
                    ,0x14b,
                    "int AF_DSpotState_GetNextInList(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    val = DSpotState::GetNextInList(this,type_00,param[2].field_0.i);
    if (numret < 1) {
      param_local._4_4_ = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_specialspot.cpp"
                      ,0x14c,
                      "int AF_DSpotState_GetNextInList(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      VMReturn::SetPointer(ret,val,1);
      param_local._4_4_ = 1;
    }
    return param_local._4_4_;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_specialspot.cpp"
                ,0x14a,
                "int AF_DSpotState_GetNextInList(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(DSpotState, GetNextInList)
{
	PARAM_SELF_PROLOGUE(DSpotState);
	PARAM_CLASS(type, AActor);
	PARAM_INT(skipcounter);
	ACTION_RETURN_OBJECT(self->GetNextInList(type, skipcounter));
}